

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

void commit(uint8_t *digest,uint8_t *seed,uint8_t *aux,uint8_t *salt,size_t t,size_t j,
           picnic_instance_t *params)

{
  long in_RDX;
  hash_context ctx;
  undefined6 in_stack_fffffffffffffee8;
  uint16_t in_stack_fffffffffffffeee;
  hash_context *in_stack_fffffffffffffef0;
  
  hash_init(in_stack_fffffffffffffef0,CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8))
  ;
  hash_update(in_stack_fffffffffffffef0,
              (uint8_t *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),0x140a47);
  if (in_RDX != 0) {
    hash_update(in_stack_fffffffffffffef0,
                (uint8_t *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),0x140a72);
  }
  hash_update(in_stack_fffffffffffffef0,
              (uint8_t *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),0x140a89);
  hash_update_uint16_le(in_stack_fffffffffffffef0,in_stack_fffffffffffffeee);
  hash_update_uint16_le(in_stack_fffffffffffffef0,in_stack_fffffffffffffeee);
  hash_final((hash_context *)0x140abd);
  hash_squeeze(in_stack_fffffffffffffef0,
               (uint8_t *)CONCAT26(in_stack_fffffffffffffeee,in_stack_fffffffffffffee8),0x140add);
  return;
}

Assistant:

static void commit(uint8_t* digest, const uint8_t* seed, const uint8_t* aux, const uint8_t* salt,
                   size_t t, size_t j, const picnic_instance_t* params) {
  /* Compute C[t][j];  as digest = H(seed||[aux]) aux is optional */
  hash_context ctx;

  hash_init(&ctx, params->digest_size);
  hash_update(&ctx, seed, params->seed_size);
  if (aux != NULL) {
    hash_update(&ctx, aux, params->view_size);
  }
  hash_update(&ctx, salt, SALT_SIZE);
  hash_update_uint16_le(&ctx, t);
  hash_update_uint16_le(&ctx, j);
  hash_final(&ctx);
  hash_squeeze(&ctx, digest, params->digest_size);
  hash_clear(&ctx);
}